

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

void __thiscall HV_Edit_Buffer::~HV_Edit_Buffer(HV_Edit_Buffer *this)

{
  free(this->buf_);
  return;
}

Assistant:

HV_Edit_Buffer::~HV_Edit_Buffer() {

  if (buf_) {
#if (DEBUG_EDIT_BUFFER)
    printf("~HV_Edit_Buffer(): size = %d, allocated = %d\n",
      size_, allocated_);
    fflush(stdout);
#endif
    free(buf_);
  }
}